

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToSkipComments(Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = false;
  while( true ) {
    cVar1 = Stream::peek(&this->stream_);
    if (cVar1 != '/') {
      return bVar2;
    }
    iVar3 = Stream::advance(&this->stream_);
    if (iVar3 != 0x2f) break;
    while ((cVar1 = Stream::peek(&this->stream_), cVar1 != '\n' &&
           (bVar2 = Stream::eof(&this->stream_), !bVar2))) {
      Stream::advance(&this->stream_);
    }
    Stream::advance(&this->stream_);
    bVar2 = true;
  }
  Stream::unget(&this->stream_);
  return bVar2;
}

Assistant:

bool Tokenizer::tryToSkipComments()
{
  bool result = false;
  while(stream_.peek() == '/')
  {
    if(stream_.advance() == '/')
    {
      result = true;
      while(stream_.peek() != '\n' && !stream_.eof())
        stream_.advance();
      stream_.advance();
    }
    else
    {
      stream_.unget();
      break;
    }
  }

  return result;
}